

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,int,duckdb::BinaryStandardOperatorWrapper,duckdb::BitPositionOperator,bool,false,true>
               (string_t *ldata,string_t *rdata,int *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  unsigned_long *puVar5;
  undefined8 uVar6;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  int iVar19;
  idx_t iVar20;
  idx_t iVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  char **ppcVar27;
  bitstring_t substring;
  bitstring_t substring_00;
  bitstring_t substring_01;
  bitstring_t bits;
  bitstring_t bits_00;
  bitstring_t bits_01;
  char **local_68;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar6 = *(undefined8 *)&rdata->value;
      local_68 = &(ldata->value).pointer.ptr;
      iVar20 = 0;
      do {
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(local_68 + -1);
        uVar4 = paVar1->length;
        uVar9 = paVar1->prefix[0];
        uVar12 = paVar1->prefix[1];
        uVar15 = paVar1->prefix[2];
        uVar18 = paVar1->prefix[3];
        substring_01.value.pointer.prefix[3] = uVar18;
        substring_01.value.pointer.prefix[2] = uVar15;
        substring_01.value.pointer.prefix[1] = uVar12;
        substring_01.value.pointer.prefix[0] = uVar9;
        substring_01.value.pointer.length = uVar4;
        iVar19 = 0;
        if ((uint)uVar4 <= (uint)uVar6) {
          substring_01.value.pointer.ptr = *local_68;
          bits_01.value.pointer.ptr = (rdata->value).pointer.ptr;
          bits_01.value._0_8_ = uVar6;
          iVar21 = Bit::BitPosition(substring_01,bits_01);
          iVar19 = (int)iVar21;
        }
        result_data[iVar20] = iVar19;
        iVar20 = iVar20 + 1;
        local_68 = local_68 + 2;
      } while (count != iVar20);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar22 = 0;
    uVar24 = 0;
    do {
      puVar5 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        uVar23 = 0xffffffffffffffff;
      }
      else {
        uVar23 = puVar5[uVar22];
      }
      uVar26 = uVar24 + 0x40;
      if (count <= uVar24 + 0x40) {
        uVar26 = count;
      }
      uVar25 = uVar26;
      if (uVar23 != 0) {
        uVar25 = uVar24;
        if (uVar23 == 0xffffffffffffffff) {
          if (uVar24 < uVar26) {
            uVar6 = *(undefined8 *)&rdata->value;
            ppcVar27 = &ldata[uVar24].value.pointer.ptr;
            do {
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar27 + -1);
              uVar2 = paVar1->length;
              uVar7 = paVar1->prefix[0];
              uVar10 = paVar1->prefix[1];
              uVar13 = paVar1->prefix[2];
              uVar16 = paVar1->prefix[3];
              substring.value.pointer.prefix[3] = uVar16;
              substring.value.pointer.prefix[2] = uVar13;
              substring.value.pointer.prefix[1] = uVar10;
              substring.value.pointer.prefix[0] = uVar7;
              substring.value.pointer.length = uVar2;
              iVar19 = 0;
              if ((uint)uVar2 <= (uint)uVar6) {
                substring.value.pointer.ptr = *ppcVar27;
                bits.value.pointer.ptr = (rdata->value).pointer.ptr;
                bits.value._0_8_ = uVar6;
                iVar20 = Bit::BitPosition(substring,bits);
                iVar19 = (int)iVar20;
              }
              result_data[uVar25] = iVar19;
              uVar25 = uVar25 + 1;
              ppcVar27 = ppcVar27 + 2;
            } while (uVar26 != uVar25);
          }
        }
        else if (uVar24 < uVar26) {
          ppcVar27 = &ldata[uVar24].value.pointer.ptr;
          uVar25 = 0;
          do {
            if ((uVar23 >> (uVar25 & 0x3f) & 1) != 0) {
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar27 + -1);
              uVar3 = paVar1->length;
              uVar8 = paVar1->prefix[0];
              uVar11 = paVar1->prefix[1];
              uVar14 = paVar1->prefix[2];
              uVar17 = paVar1->prefix[3];
              substring_00.value.pointer.prefix[3] = uVar17;
              substring_00.value.pointer.prefix[2] = uVar14;
              substring_00.value.pointer.prefix[1] = uVar11;
              substring_00.value.pointer.prefix[0] = uVar8;
              substring_00.value.pointer.length = uVar3;
              iVar19 = 0;
              if ((uint)uVar3 <= (uint)*(undefined8 *)&rdata->value) {
                substring_00.value.pointer.ptr = *ppcVar27;
                bits_00.value.pointer.ptr = (rdata->value).pointer.ptr;
                bits_00.value._0_8_ = *(undefined8 *)&rdata->value;
                iVar20 = Bit::BitPosition(substring_00,bits_00);
                iVar19 = (int)iVar20;
              }
              result_data[uVar24 + uVar25] = iVar19;
            }
            uVar25 = uVar25 + 1;
            ppcVar27 = ppcVar27 + 2;
          } while ((uVar24 - uVar26) + uVar25 != 0);
          uVar25 = uVar24 + uVar25;
        }
      }
      uVar22 = uVar22 + 1;
      uVar24 = uVar25;
    } while (uVar22 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}